

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O3

IterateResult __thiscall deqp::gls::FragOpInteractionCase::iterate(FragOpInteractionCase *this)

{
  size_type *psVar1;
  undefined8 *puVar2;
  VertexArrayPointer *pVVar3;
  uint uVar4;
  TestLog *pTVar5;
  Variable *pVVar6;
  ShaderInput *pSVar7;
  float *pfVar8;
  pointer pcVar9;
  long lVar10;
  long lVar11;
  uint *puVar12;
  TextureFormat TVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  pointer pVVar18;
  pointer puVar19;
  uint uVar20;
  deBool dVar21;
  deUint32 dVar22;
  deUint32 dVar23;
  deBool dVar24;
  int iVar25;
  TextureFormat *pTVar26;
  undefined8 *puVar27;
  InternalError *pIVar28;
  ulong *puVar29;
  long lVar30;
  pointer ppSVar31;
  ulong *puVar32;
  float *pfVar33;
  undefined4 extraout_var;
  _func_int **pp_Var34;
  undefined8 uVar35;
  undefined4 extraout_var_00;
  TestError *this_00;
  int iVar36;
  uint uVar37;
  TextureFormat TVar38;
  pointer ppSVar39;
  ulong uVar40;
  pointer puVar41;
  uint uVar42;
  ulong uVar43;
  int ndx;
  IterateResult IVar44;
  _Alloc_hider _Var45;
  int iVar46;
  byte bVar47;
  int iVar48;
  long lVar49;
  ulong uVar50;
  ulong uVar51;
  pointer_____offset_0x10___ *ppuVar52;
  pointer puVar53;
  void *pvVar54;
  uint uVar55;
  float *pfVar56;
  GLContext *pGVar57;
  long lVar58;
  ulong *puVar59;
  bool bVar60;
  bool bVar61;
  float fVar62;
  float fVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  float *dst;
  VertexDataStorage vertexData;
  vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> uniformValues;
  Surface reference;
  Surface rendered;
  Vector<float,_3> result;
  Vector<float,_3> res;
  Random rnd;
  ScopedLogSection section;
  pointer in_stack_fffffffffffffc58;
  deUint32 local_378;
  uint uStack_374;
  long local_348;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_338;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vStack_320;
  string local_308;
  Surface local_2e8;
  Surface local_2c8;
  undefined1 local_2a8 [8];
  undefined8 uStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  void *local_288;
  PixelBufferAccess local_280;
  TextureFormat local_258;
  long lStack_250;
  ulong local_240;
  uint local_238;
  float local_234;
  float local_230;
  float local_22c;
  float local_228;
  uint local_224;
  float local_220;
  float local_21c;
  deRandom local_218;
  TextureFormat local_208;
  long lStack_200;
  pointer local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  long local_1c8;
  void **local_1c0;
  ScopedLogSection local_1b8;
  undefined1 local_1b0 [8];
  TextureFormat local_1a8;
  undefined1 local_1a0 [24];
  ChannelOrder local_188;
  VertexArrayPointer local_180 [2];
  ios_base local_140 [264];
  GLContext *local_38;
  
  uVar20 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar20 = (uVar20 >> 4 ^ uVar20) * 0x27d4eb2d;
  deRandom_init(&local_218,uVar20 >> 0xf ^ (this->m_params).seed ^ uVar20);
  pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_208 = (TextureFormat)&local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Iter","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  puVar53 = (pointer)0xf;
  if (local_208 != (TextureFormat)&local_1f8) {
    puVar53 = local_1f8;
  }
  if (puVar53 < local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish + lStack_200) {
    puVar53 = (pointer)0xf;
    if ((pointer *)
        local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      puVar53 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (puVar53 < local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish + lStack_200) goto LAB_004b972a;
    pTVar26 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,(ulong)local_208);
  }
  else {
LAB_004b972a:
    pTVar26 = (TextureFormat *)
              std::__cxx11::string::_M_append
                        ((char *)&local_208,
                         (ulong)local_338.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
  }
  local_2a8 = (undefined1  [8])&local_298;
  TVar38 = (TextureFormat)(pTVar26 + 2);
  if (*pTVar26 == TVar38) {
    TVar13 = pTVar26[3];
    local_298._M_allocated_capacity._0_5_ = (undefined5)*(size_type *)TVar38;
    local_298._M_allocated_capacity._5_3_ = (undefined3)(*(size_type *)TVar38 >> 0x28);
    local_298._8_5_ = TVar13._0_5_;
    local_298._M_local_buf[0xd] = TVar13.type._1_1_;
    local_298._14_2_ = TVar13.type._2_2_;
  }
  else {
    local_298._M_allocated_capacity._0_5_ = (undefined5)*(size_type *)TVar38;
    local_298._M_allocated_capacity._5_3_ = (undefined3)(*(size_type *)TVar38 >> 0x28);
    local_2a8 = (undefined1  [8])*pTVar26;
  }
  uStack_2a0._0_4_ = pTVar26[1].order;
  uStack_2a0._4_4_ = pTVar26[1].type;
  *pTVar26 = TVar38;
  pTVar26[1].order = R;
  pTVar26[1].type = SNORM_INT8;
  *(char *)TVar38 = '\0';
  puVar2 = &local_2c8.m_pixels.m_cap;
  local_2c8._0_8_ = puVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Iteration ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ostream::operator<<(local_1b0,this->m_iterNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  std::ios_base::~ios_base(local_140);
  pvVar54 = (void *)0xf;
  if ((undefined8 *)local_2c8._0_8_ != puVar2) {
    pvVar54 = (void *)local_2c8.m_pixels.m_cap;
  }
  if (pvVar54 < (void *)((long)local_2e8.m_pixels.m_ptr + (long)local_2c8.m_pixels.m_ptr)) {
    pvVar54 = (void *)0xf;
    if ((size_t *)CONCAT44(local_2e8.m_height,local_2e8.m_width) != &local_2e8.m_pixels.m_cap) {
      pvVar54 = (void *)local_2e8.m_pixels.m_cap;
    }
    if ((void *)((long)local_2e8.m_pixels.m_ptr + (long)local_2c8.m_pixels.m_ptr) <= pvVar54) {
      puVar27 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,local_2c8._0_8_);
      goto LAB_004b9896;
    }
  }
  puVar27 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&local_2c8,(ulong)CONCAT44(local_2e8.m_height,local_2e8.m_width));
LAB_004b9896:
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  psVar1 = puVar27 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar27 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_308.field_2._M_allocated_capacity = *psVar1;
    local_308.field_2._8_8_ = puVar27[3];
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar1;
    local_308._M_dataplus._M_p = (pointer)*puVar27;
  }
  local_308._M_string_length = puVar27[1];
  *puVar27 = psVar1;
  puVar27[1] = 0;
  *(undefined1 *)psVar1 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1b8,pTVar5,(string *)local_2a8,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((size_t *)CONCAT44(local_2e8.m_height,local_2e8.m_width) != &local_2e8.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(local_2e8.m_height,local_2e8.m_width),
                    local_2e8.m_pixels.m_cap + 1);
  }
  if ((undefined8 *)local_2c8._0_8_ != puVar2) {
    operator_delete((void *)local_2c8._0_8_,local_2c8.m_pixels.m_cap + 1);
  }
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8,
                    CONCAT35(local_298._M_allocated_capacity._5_3_,
                             local_298._M_allocated_capacity._0_5_) + 1);
  }
  if ((pointer *)
      local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (ulong)(local_338.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_208 != (TextureFormat)&local_1f8) {
    operator_delete((void *)local_208,(ulong)(local_1f8 + 1));
  }
  ppSVar31 = (this->m_vertexShader).m_inputs.
             super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                              super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar31) >> 3)) {
    local_348 = 9;
    lVar58 = 0;
    do {
      dVar21 = deStringEqual((ppSVar31[lVar58]->m_variable->m_name)._M_dataplus._M_p,"dEQP_Position"
                            );
      if (dVar21 != 0) {
        vStack_320.
        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_320.
        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_320.
        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ppSVar31 = (this->m_vertexShader).m_inputs.
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        local_1c0 = &local_288;
        if (ppSVar31 ==
            (this->m_vertexShader).m_inputs.
            super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          iVar25 = 0;
        }
        else {
          iVar25 = 0;
          do {
            pVVar6 = (*ppSVar31)->m_variable;
            if (((pVVar6->m_type).m_baseType != TYPE_FLOAT) ||
               (iVar36 = (pVVar6->m_type).m_numElements, 3 < iVar36 - 1U)) {
              pIVar28 = (InternalError *)__cxa_allocate_exception(0x38);
              tcu::InternalError::InternalError
                        (pIVar28,(char *)0x0,
                         "type.getBaseType() == rsg::VariableType::TYPE_FLOAT && de::inRange(type.getNumElements(), 1, 4)"
                         ,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                         ,0x5c);
              __cxa_throw(pIVar28,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_208,(pVVar6->m_name)._M_dataplus._M_p,
                       (allocator<char> *)&local_308);
            local_2a8._0_4_ = A;
            uStack_2a0 = (void *)((long)&local_298 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&uStack_2a0,local_208,lStack_200 + (long)local_208);
            local_280.super_ConstPixelBufferAccess.m_format.order = R;
            local_1b0._0_4_ = local_2a8._0_4_;
            local_1a8 = (TextureFormat)(local_1a0 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_1b0 + 8),uStack_2a0,
                       CONCAT35(local_298._M_allocated_capacity._5_3_,
                                local_298._M_allocated_capacity._0_5_) + (long)uStack_2a0);
            local_180[0].data = (void *)(long)iVar25;
            local_188 = local_280.super_ConstPixelBufferAccess.m_format.order;
            local_180[0].componentType = VTX_COMP_FLOAT;
            local_180[0].convert = VTX_COMP_CONVERT_NONE;
            local_180[0].numElements = 4;
            local_180[0].stride = 0;
            local_180[0].numComponents = iVar36;
            if (uStack_2a0 != (void *)((long)&local_298 + 8)) {
              operator_delete(uStack_2a0,
                              CONCAT26(local_298._14_2_,
                                       CONCAT15(local_298._M_local_buf[0xd],local_298._8_5_)) + 1);
            }
            std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
            emplace_back<glu::VertexArrayBinding>(&vStack_320,(VertexArrayBinding *)local_1b0);
            if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
              operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
            }
            if (local_208 != (TextureFormat)&local_1f8) {
              operator_delete((void *)local_208,(ulong)(local_1f8 + 1));
            }
            iVar25 = iVar25 + iVar36 * 4;
            ppSVar31 = ppSVar31 + 1;
            pVVar18 = vStack_320.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          } while (ppSVar31 !=
                   (this->m_vertexShader).m_inputs.
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
          for (; pVVar18 !=
                 vStack_320.
                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                 ._M_impl.super__Vector_impl_data._M_finish; pVVar18 = pVVar18 + 1) {
            (pVVar18->pointer).stride = iVar25;
          }
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&local_338,(long)(iVar25 << 2));
        local_308._M_dataplus._M_p = (pointer)0x0;
        local_308._M_string_length = 0;
        local_308.field_2._M_allocated_capacity = 0;
        puVar29 = (ulong *)operator_new(800);
        local_240 = 0;
        local_1c8 = 0;
        do {
          *(undefined4 *)((long)puVar29 + local_1c8 + 0x68) = 0;
          *(undefined2 *)((long)puVar29 + local_1c8 + 0x6c) = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x18);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined1 *)((long)puVar29 + local_1c8 + 0x28) = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x2c);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x3c);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x4c);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x55);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x70);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x80);
          *puVar2 = 0;
          puVar2[1] = 0;
          puVar2 = (undefined8 *)((long)puVar29 + local_1c8 + 0x8d);
          *puVar2 = 0;
          puVar2[1] = 0;
          *(undefined8 *)((long)puVar29 + local_1c8) = 0;
          ((undefined8 *)((long)puVar29 + local_1c8))[1] = 0;
          *(undefined8 *)((long)puVar29 + local_1c8 + 0xd) = 0;
          local_1c8 = local_1c8 + 0xa0;
          local_240 = local_240 + 1;
        } while (local_240 != 5);
        tcu::Surface::Surface
                  (&local_2c8,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
        tcu::Surface::Surface
                  (&local_2e8,(this->m_viewportSize).m_data[0],(this->m_viewportSize).m_data[1]);
        local_208.order = R;
        local_208.type = SNORM_INT8;
        lStack_200 = 0x3f80000000000000;
        local_1f8 = (pointer)0x3f800000;
        uStack_1f0 = 0x3f0000003f000000;
        local_1e8 = 0x3f80000000000000;
        uStack_1e0 = 0x3f0000003f000000;
        local_1d8 = 0x3f8000003f800000;
        uStack_1d0 = 0x3f800000;
        rsg::computeUniformValues
                  ((Random *)&local_218,
                   (vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)&local_308,
                   &this->m_unifiedUniforms);
        ppSVar31 = (this->m_vertexShader).m_inputs.
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppSVar39 = (this->m_vertexShader).m_inputs.
                   super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        if (0 < (int)((ulong)((long)ppSVar39 - (long)ppSVar31) >> 3)) {
          lVar49 = 0;
          do {
            pVVar18 = vStack_320.
                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar19 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            puVar53 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (lVar58 != lVar49) {
              pSVar7 = ppSVar31[lVar49];
              pVVar6 = pSVar7->m_variable;
              pfVar33 = *(float **)
                         &(pSVar7->m_min).
                          super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                          super__Vector_impl_data;
              pfVar8 = *(float **)
                        &(pSVar7->m_max).
                         super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
                         super__Vector_impl_data;
              iVar25 = (pVVar6->m_type).m_numElements;
              pVVar3 = &vStack_320.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar49].pointer;
              uVar14 = pVVar3->numComponents;
              uVar15 = pVVar3->numElements;
              iVar36 = vStack_320.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar49].pointer.stride;
              pvVar54 = vStack_320.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar49].pointer.data;
              local_1b0._0_4_ =
                   vStack_320.
                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar49].binding.type;
              local_1a8 = (TextureFormat)(local_1a0 + 8);
              pcVar9 = vStack_320.
                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar49].binding.name._M_dataplus.
                       _M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_1b0 + 8),pcVar9,
                         pcVar9 + vStack_320.
                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                  ._M_impl.super__Vector_impl_data._M_start[lVar49].binding.name.
                                  _M_string_length);
              puVar41 = (pointer)0x0;
              if (puVar53 != puVar19) {
                puVar41 = puVar53;
              }
              local_188 = pVVar18[lVar49].binding.location;
              iVar48 = 0;
              local_180[0].componentType = pVVar3->componentType;
              local_180[0].convert = pVVar3->convert;
              local_180[0].numComponents = uVar14;
              local_180[0].numElements = uVar15;
              local_180[0].stride = iVar36;
              local_180[0].data = puVar41 + (long)pvVar54;
              pvVar54 = uStack_2a0;
              do {
                uStack_2a0._4_4_ = (ChannelType)((ulong)pvVar54 >> 0x20);
                iVar36 = iVar48 + (int)lVar49;
                uVar37 = iVar36 + this->m_iterNdx;
                uVar20 = this->m_iterNdx + iVar36 + 3;
                if (-1 < (int)uVar37) {
                  uVar20 = uVar37;
                }
                if (iVar25 - 1U < 4) {
                  lVar30 = (long)(int)(uVar37 - (uVar20 & 0xfffffffc));
                  pTVar26 = &local_208 + lVar30 * 2;
                  uStack_2a0 = pvVar54;
                  switch(iVar25) {
                  case 1:
                    fVar62 = (float)pTVar26->order;
                    rsg::VariableType::getElementType(&pVVar6->m_type);
                    fVar63 = *pfVar33;
                    rsg::VariableType::getElementType(&pVVar6->m_type);
                    *(float *)((long)local_180[0].data + (long)(local_180[0].stride * iVar48)) =
                         fVar62 * *pfVar8 + fVar63 * (1.0 - fVar62);
                    pvVar54 = uStack_2a0;
                    break;
                  case 2:
                    local_21c = (float)pTVar26->order;
                    local_220 = (float)(&local_208)[lVar30 * 2].type;
                    local_2a8._0_4_ = R;
                    local_258 = (TextureFormat)((ulong)local_258 & 0xffffffff00000000);
                    pfVar56 = &local_21c;
                    pTVar26 = (TextureFormat *)local_2a8;
                    lVar30 = 0;
                    bVar61 = true;
                    do {
                      bVar60 = bVar61;
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      fVar62 = pfVar33[lVar30];
                      fVar63 = *pfVar56;
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      pTVar26->order =
                           (ChannelOrder)(pfVar8[lVar30] * *pfVar56 + fVar62 * (1.0 - fVar63));
                      lVar30 = 1;
                      pfVar56 = &local_220;
                      pTVar26 = &local_258;
                      bVar61 = false;
                    } while (bVar60);
                    *(undefined4 *)((long)local_180[0].data + (long)(local_180[0].stride * iVar48))
                         = local_2a8._0_4_;
                    *(ChannelOrder *)
                     ((long)local_180[0].data + (long)(local_180[0].stride * iVar48) + 4) =
                         local_258.order;
                    pvVar54 = uStack_2a0;
                    break;
                  case 3:
                    lStack_250 = CONCAT44(lStack_250._4_4_,(int)(&lStack_200)[lVar30 * 2]);
                    local_258 = *pTVar26;
                    local_2a8._0_4_ = R;
                    local_2a8._4_4_ = SNORM_INT8;
                    uStack_2a0._0_4_ = 0;
                    lVar30 = 0;
                    do {
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      fVar62 = pfVar33[lVar30];
                      fVar63 = (float)(&local_258.order)[lVar30];
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      *(float *)(local_2a8 + lVar30 * 4) =
                           fVar63 * pfVar8[lVar30] + fVar62 * (1.0 - fVar63);
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != 3);
                    *(ChannelOrder *)
                     ((long)local_180[0].data + (long)(local_180[0].stride * iVar48) + 8) =
                         (ChannelOrder)uStack_2a0;
                    *(ulong *)((long)local_180[0].data + (long)(local_180[0].stride * iVar48)) =
                         CONCAT44(local_2a8._4_4_,local_2a8._0_4_);
                    pvVar54 = (void *)CONCAT44(uStack_2a0._4_4_,(ChannelOrder)uStack_2a0);
                    break;
                  case 4:
                    local_258 = *pTVar26;
                    lStack_250 = (&lStack_200)[lVar30 * 2];
                    local_2a8._0_4_ = R;
                    local_2a8._4_4_ = SNORM_INT8;
                    uStack_2a0._0_4_ = 0;
                    uStack_2a0._4_4_ = 0;
                    lVar30 = 0;
                    do {
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      fVar62 = pfVar33[lVar30];
                      fVar63 = (float)(&local_258.order)[lVar30];
                      rsg::VariableType::getElementType(&pVVar6->m_type);
                      *(float *)(local_2a8 + lVar30 * 4) =
                           fVar63 * pfVar8[lVar30] + fVar62 * (1.0 - fVar63);
                      lVar30 = lVar30 + 1;
                    } while (lVar30 != 4);
                    auVar17._4_4_ = local_2a8._4_4_;
                    auVar17._0_4_ = local_2a8._0_4_;
                    auVar17._8_4_ = (ChannelOrder)uStack_2a0;
                    auVar17._12_4_ = uStack_2a0._4_4_;
                    *(undefined1 (*) [16])
                     ((long)local_180[0].data + (long)(local_180[0].stride * iVar48)) = auVar17;
                    pvVar54 = (void *)CONCAT44(uStack_2a0._4_4_,(ChannelOrder)uStack_2a0);
                  }
                }
                iVar48 = iVar48 + 1;
              } while (iVar48 != 4);
              uStack_2a0 = pvVar54;
              if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
                operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
              }
              ppSVar31 = (this->m_vertexShader).m_inputs.
                         super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              ppSVar39 = (this->m_vertexShader).m_inputs.
                         super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
            }
            lVar49 = lVar49 + 1;
          } while (lVar49 < (int)((ulong)((long)ppSVar39 - (long)ppSVar31) >> 3));
        }
        puVar32 = (ulong *)((long)puVar29 + local_1c8 + -0xa0);
        puVar59 = puVar29;
        if (local_1c8 != 0) {
          do {
            uVar20 = (*this->m_renderCtx->_vptr_RenderContext[2])();
            iVar25 = (this->m_viewportSize).m_data[0];
            iVar36 = (this->m_viewportSize).m_data[1];
            fVar62 = ceilf((float)iVar25 * 0.5);
            fVar63 = ceilf((float)iVar36 * 0.5);
            local_378 = deRandom_getUint32(&local_218);
            iVar48 = (int)fVar62;
            if (iVar48 != -0x80000000 || iVar25 != 0x7fffffff) {
              local_378 = local_378 % ((iVar25 - iVar48) + 1U) + iVar48;
            }
            dVar22 = deRandom_getUint32(&local_218);
            iVar48 = (int)fVar63;
            iVar46 = -0x80000000;
            if (iVar48 != -0x80000000 || iVar36 != 0x7fffffff) {
              iVar46 = iVar36 + 1;
              dVar22 = dVar22 % (uint)(iVar46 - iVar48) + iVar48;
            }
            dVar23 = deRandom_getUint32(&local_218);
            uVar51 = (ulong)dVar23 % (ulong)((iVar25 - local_378) + 1);
            dVar23 = deRandom_getUint32(&local_218);
            uVar40 = (ulong)dVar23 % (ulong)(iVar46 - dVar22);
            uVar42 = (uint)uVar40;
            dVar21 = deRandom_getBool(&local_218);
            dVar24 = deRandom_getBool(&local_218);
            uVar37 = (dVar22 - 1) + uVar42;
            if (dVar24 == 1) {
              uVar40 = (ulong)uVar37;
              uVar37 = uVar42;
            }
            uVar42 = (local_378 - 1) + (int)uVar51;
            uVar50 = uVar51;
            if (dVar21 == 1) {
              uVar50 = (ulong)uVar42;
            }
            uVar43 = (ulong)uVar42;
            if (dVar21 == 1) {
              uVar43 = uVar51;
            }
            *puVar59 = uVar50 | uVar40 << 0x20;
            puVar59[1] = uVar43 | (ulong)uVar37 << 0x20;
            local_1b0 = (undefined1  [8])((ulong)local_1b0 & 0xffffffff00000000);
            de::Random::choose<float_const*,float*>
                      ((Random *)&local_218,
                       (float *)(anonymous_namespace)::getRandomDepth(de::Random&)::depthValues,
                       (float *)&DAT_00670a70,(float *)local_1b0,1);
            *(undefined4 *)(puVar59 + 2) = local_1b0._0_4_;
            InteractionTestUtil::computeRandomRenderState
                      ((Random *)&local_218,(RenderState *)((long)puVar59 + 0x14),
                       (ApiType)(uVar20 & 0x3ff),iVar25,iVar36);
            bVar61 = puVar32 != puVar59;
            puVar59 = puVar59 + 0x14;
          } while (bVar61);
        }
        pVVar18 = vStack_320.
                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar19 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        puVar53 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (0 < (int)local_240) {
          pfVar33 = (float *)(puVar29 + 2);
          lVar58 = 0;
          do {
            *pfVar33 = (float)(int)lVar58 * 0.0231725 + *pfVar33;
            lVar58 = lVar58 + 1;
            pfVar33 = pfVar33 + 0x28;
          } while (lVar58 != 5);
        }
        puVar2 = (undefined8 *)
                 ((long)vStack_320.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_348 * 8 + -0x18);
        uVar35 = *puVar2;
        uVar16 = puVar2[1];
        uVar20 = *(uint *)((long)vStack_320.
                                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_348 * 8 + -8);
        lVar58 = *(long *)(&((vStack_320.
                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start)->binding).type +
                          local_348 * 2);
        local_1b0._0_4_ =
             *(Type *)((long)vStack_320.
                             super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                             ._M_impl.super__Vector_impl_data._M_start + local_348 * 8 + -0x48);
        local_1a8 = (TextureFormat)(local_1a0 + 8);
        lVar49 = *(long *)((long)vStack_320.
                                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_348 * 8 + -0x40);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)(local_1b0 + 8),lVar49,
                   *(long *)((long)vStack_320.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_348 * 8 + -0x38
                            ) + lVar49);
        puVar41 = (pointer)0x0;
        if (puVar53 != puVar19) {
          puVar41 = puVar53;
        }
        puVar41 = puVar41 + lVar58;
        local_188 = *(uint *)((long)pVVar18 + local_348 * 8 + -0x20);
        local_180[0].numComponents = (int)uVar16;
        local_180[0].numElements = (int)((ulong)uVar16 >> 0x20);
        local_180[0]._0_8_ = uVar35;
        local_180[0].stride = uVar20;
        local_180[0].data = puVar41;
        if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
          operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
        }
        local_38 = (GLContext *)&this->m_referenceCtx->context;
        pGVar57 = this->m_glCtx;
        uVar51._0_4_ = this->m_glProgram;
        uVar51._4_4_ = this->m_refProgram;
        local_1b0._0_4_ = RGBA;
        local_1b0._4_4_ = UNORM_INT8;
        pvVar54 = (void *)local_2c8.m_pixels.m_cap;
        if ((void *)local_2c8.m_pixels.m_cap != (void *)0x0) {
          pvVar54 = local_2c8.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_2a8,(TextureFormat *)local_1b0,local_2c8.m_width,
                   local_2c8.m_height,1,pvVar54);
        local_1b0._0_4_ = RGBA;
        local_1b0._4_4_ = UNORM_INT8;
        pvVar54 = (void *)local_2e8.m_pixels.m_cap;
        if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
          pvVar54 = local_2e8.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  (&local_280,(TextureFormat *)local_1b0,local_2e8.m_width,local_2e8.m_height,1,
                   pvVar54);
        iVar25 = (*this->m_renderCtx->_vptr_RenderContext[4])();
        lVar58 = CONCAT44(extraout_var,iVar25);
        local_228 = anon_unknown_0::getWellBehavingChannelColor(0.0,*(int *)(lVar58 + 8));
        local_22c = anon_unknown_0::getWellBehavingChannelColor(0.25,*(int *)(lVar58 + 0xc));
        local_230 = anon_unknown_0::getWellBehavingChannelColor(0.5,*(int *)(lVar58 + 0x10));
        local_234 = anon_unknown_0::getWellBehavingChannelColor(1.0,*(int *)(lVar58 + 0x14));
        lVar58 = (long)(int)(uVar20 * 2);
        iVar25 = uVar20 * 3;
        uVar40 = uVar51 & 0xffffffff;
        local_238 = uVar51._4_4_;
        uVar35 = CONCAT71((int7)(int3)((uint)iVar25 >> 8),1);
        do {
          local_240 = CONCAT44(local_240._4_4_,(int)uVar40);
          local_224 = (uint)uVar35;
          if (0 < (int)((ulong)((long)vStack_320.
                                      super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)vStack_320.
                                     super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x33333333)
          {
            lVar49 = 0x48;
            lVar30 = 0;
            do {
              pVVar18 = vStack_320.
                        super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              puVar19 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
              puVar53 = local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              local_1a8 = (TextureFormat)(local_1a0 + 8);
              puVar2 = (undefined8 *)
                       ((long)vStack_320.
                              super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                              ._M_impl.super__Vector_impl_data._M_start + lVar49 + -0x18);
              uVar35 = *puVar2;
              uVar16 = puVar2[1];
              uVar37 = *(uint *)((long)vStack_320.
                                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar49 + -8);
              lVar10 = *(long *)((long)&((vStack_320.
                                          super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->binding).type
                                + lVar49);
              local_1b0._0_4_ =
                   *(Type *)((long)vStack_320.
                                   super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                   ._M_impl.super__Vector_impl_data._M_start + lVar49 + -0x48);
              lVar11 = *(long *)((long)vStack_320.
                                       super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar49 + -0x40);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_1b0 + 8),lVar11,
                         *(long *)((long)vStack_320.
                                         super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                         ._M_impl.super__Vector_impl_data._M_start + lVar49 + -0x38)
                         + lVar11);
              local_180[0].data = (pointer)0x0;
              if (puVar53 != puVar19) {
                local_180[0].data = puVar53;
              }
              local_180[0].data = (void *)((long)local_180[0].data + lVar10);
              uVar42 = *(uint *)((long)pVVar18 + lVar49 + -0x20);
              local_180[0].numComponents = (int)uVar16;
              local_180[0].numElements = (int)((ulong)uVar16 >> 0x20);
              local_188 = uVar42;
              local_180[0]._0_8_ = uVar35;
              local_180[0].stride = uVar37;
              if ((float)local_1b0._0_4_ == 1.4013e-45) {
                uVar42 = (*(pGVar57->super_Context)._vptr_Context[0x59])
                                   (pGVar57,local_240 & 0xffffffff,local_1a8);
              }
              if (-1 < (int)uVar42) {
                (*(pGVar57->super_Context)._vptr_Context[0x50])(pGVar57,(ulong)uVar42);
                in_stack_fffffffffffffc58 = (pointer)local_180[0].data;
                (*(pGVar57->super_Context)._vptr_Context[0x4e])
                          (pGVar57,(ulong)uVar42,(ulong)(uint)local_180[0].numComponents,0x1406,0,
                           (ulong)(uint)local_180[0].stride,local_180[0].data);
              }
              if (local_1a8 != (TextureFormat)(local_1a0 + 8)) {
                operator_delete((void *)local_1a8,local_1a0._8_8_ + 1);
              }
              lVar30 = lVar30 + 1;
              lVar49 = lVar49 + 0x50;
            } while (lVar30 < (int)((ulong)((long)vStack_320.
                                                  super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)vStack_320.
                                                 super__Vector_base<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              -0x33333333);
          }
          (*(pGVar57->super_Context)._vptr_Context[0x34])(pGVar57,0xc11);
          uVar51 = local_240;
          (*(pGVar57->super_Context)._vptr_Context[0x44])(pGVar57,1,1,1,1);
          (*(pGVar57->super_Context)._vptr_Context[0x45])(pGVar57,1);
          (*(pGVar57->super_Context)._vptr_Context[0x46])(pGVar57,0xffffffff);
          (*(pGVar57->super_Context)._vptr_Context[0x2a])
                    ((ulong)(uint)local_228,local_22c,local_230,local_234,pGVar57);
          (*(pGVar57->super_Context)._vptr_Context[0x2d])(pGVar57,0x4500);
          (*(pGVar57->super_Context)._vptr_Context[0x76])(pGVar57,uVar51 & 0xffffffff);
          _Var45._M_p = local_308._M_dataplus._M_p;
          if (local_308._M_dataplus._M_p != (pointer)local_308._M_string_length) {
            do {
              iVar36 = (*(pGVar57->super_Context)._vptr_Context[0x66])
                                 (pGVar57,uVar51 & 0xffffffff,
                                  *(undefined8 *)(*(long *)_Var45._M_p + 0x58));
              puVar12 = *(uint **)_Var45._M_p;
              uVar37 = *puVar12;
              if (7 < uVar37) {
LAB_004bb0f0:
                this_00 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::InternalError::InternalError
                          ((InternalError *)this_00,"Unsupported type","",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                           ,0x169);
                ppuVar52 = &tcu::InternalError::typeinfo;
LAB_004bb0e1:
                __cxa_throw(this_00,ppuVar52,tcu::Exception::~Exception);
              }
              if ((0xccU >> (uVar37 & 0x1f) & 1) == 0) {
                if (uVar37 != 1) goto LAB_004bb0f0;
                uVar40 = (ulong)(puVar12[10] - 1);
                lVar49 = 0x2e0;
                if (3 < puVar12[10] - 1) {
                  this_00 = (TestError *)
                            __cxa_allocate_exception
                                      (0x38,0x2e0,uVar40,*(long *)((long)_Var45._M_p + 8));
                  tcu::TestError::TestError
                            (this_00,"Unsupported type",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                             ,0x156);
                  goto LAB_004bb0da;
                }
              }
              else {
                uVar40 = (ulong)(puVar12[10] - 1);
                lVar49 = 0x300;
                if (3 < puVar12[10] - 1) {
                  this_00 = (TestError *)
                            __cxa_allocate_exception
                                      (0x38,0x300,uVar40,*(long *)((long)_Var45._M_p + 8));
                  tcu::TestError::TestError
                            (this_00,"Unsupported type",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                             ,0x164);
LAB_004bb0da:
                  ppuVar52 = &tcu::TestError::typeinfo;
                  goto LAB_004bb0e1;
                }
              }
              (**(code **)((long)(pGVar57->super_Context)._vptr_Context + lVar49 + uVar40 * 8))
                        (pGVar57,iVar36,1);
              _Var45._M_p = _Var45._M_p + 0x20;
            } while (_Var45._M_p != (pointer)local_308._M_string_length);
          }
          uVar64 = (undefined4)((ulong)in_stack_fffffffffffffc58 >> 0x20);
          puVar59 = puVar29;
          if (local_1c8 != 0) {
            do {
              pp_Var34 = (pGVar57->super_Context)._vptr_Context;
              if (*(char *)((long)puVar59 + 0x14) == '\x01') {
                (*pp_Var34[0x33])(pGVar57,0xc11);
                (*(pGVar57->super_Context)._vptr_Context[0x32])
                          (pGVar57,(ulong)(uint)puVar59[3],(ulong)*(uint *)((long)puVar59 + 0x1c),
                           (ulong)(uint)puVar59[4],(ulong)*(uint *)((long)puVar59 + 0x24));
              }
              else {
                (*pp_Var34[0x34])(pGVar57,0xc11);
              }
              pp_Var34 = (pGVar57->super_Context)._vptr_Context;
              if ((char)puVar59[5] == '\x01') {
                (*pp_Var34[0x33])(pGVar57,0xb90);
                uVar37 = 0x404;
                lVar49 = 0;
                bVar61 = true;
                do {
                  bVar60 = bVar61;
                  lVar49 = lVar49 * 0x1c;
                  (*(pGVar57->super_Context)._vptr_Context[0x37])
                            (pGVar57,(ulong)uVar37,(ulong)*(uint *)((long)puVar59 + lVar49 + 0x2c),
                             (ulong)*(uint *)((long)puVar59 + lVar49 + 0x30),
                             (ulong)*(uint *)((long)puVar59 + lVar49 + 0x34));
                  (*(pGVar57->super_Context)._vptr_Context[0x38])
                            (pGVar57,(ulong)uVar37,(ulong)*(uint *)((long)puVar59 + lVar49 + 0x38),
                             (ulong)*(uint *)((long)puVar59 + lVar49 + 0x3c),
                             (ulong)*(uint *)((long)puVar59 + lVar49 + 0x40));
                  (*(pGVar57->super_Context)._vptr_Context[0x47])
                            (pGVar57,(ulong)uVar37,(ulong)*(uint *)((long)puVar59 + lVar49 + 0x44));
                  lVar49 = 1;
                  uVar37 = 0x405;
                  bVar61 = false;
                } while (bVar60);
              }
              else {
                (*pp_Var34[0x34])(pGVar57,0xb90);
              }
              pp_Var34 = (pGVar57->super_Context)._vptr_Context;
              if (*(char *)((long)puVar59 + 100) == '\x01') {
                (*pp_Var34[0x33])(pGVar57,0xb71);
                (*(pGVar57->super_Context)._vptr_Context[0x39])(pGVar57,(ulong)(uint)puVar59[0xd]);
                uVar51 = (ulong)*(byte *)((long)puVar59 + 0x6c);
                pp_Var34 = (pGVar57->super_Context)._vptr_Context + 0x45;
              }
              else {
                pp_Var34 = pp_Var34 + 0x34;
                uVar51 = 0xb71;
              }
              (**pp_Var34)(pGVar57,uVar51);
              pp_Var34 = (pGVar57->super_Context)._vptr_Context;
              if (*(char *)((long)puVar59 + 0x6d) == '\x01') {
                (*pp_Var34[0x33])(pGVar57,0xbe2);
                (*(pGVar57->super_Context)._vptr_Context[0x40])
                          (pGVar57,(ulong)(uint)puVar59[0xe],(ulong)*(uint *)((long)puVar59 + 0x7c))
                ;
                (*(pGVar57->super_Context)._vptr_Context[0x42])
                          (pGVar57,(ulong)*(uint *)((long)puVar59 + 0x74),(ulong)(uint)puVar59[0xf],
                           (ulong)(uint)puVar59[0x10],(ulong)*(uint *)((long)puVar59 + 0x84));
                (*(pGVar57->super_Context)._vptr_Context[0x43])
                          ((ulong)(uint)puVar59[0x11],*(uint *)((long)puVar59 + 0x8c),
                           (uint)puVar59[0x12],*(uint *)((long)puVar59 + 0x94),pGVar57);
              }
              else {
                (*pp_Var34[0x34])(pGVar57,0xbe2);
              }
              (*(pGVar57->super_Context)._vptr_Context[(ulong)((byte)puVar59[0x13] ^ 1) + 0x33])
                        (pGVar57,0xbd0);
              (*(pGVar57->super_Context)._vptr_Context[0x44])
                        (pGVar57,(ulong)*(byte *)((long)puVar59 + 0x99),
                         (ulong)*(byte *)((long)puVar59 + 0x9a),
                         (ulong)*(byte *)((long)puVar59 + 0x9b),
                         (ulong)*(byte *)((long)puVar59 + 0x9c));
              uVar37 = (uint)puVar59[2];
              local_1b0._0_4_ = 0x10000;
              local_1b0._4_4_ = 0x20002;
              local_1a8.order = 0x30001;
              uVar42 = (uint)puVar59[1];
              uVar55 = (uint)*puVar59;
              uVar66 = 0x3f800000;
              uVar65 = 0x3f800000;
              uVar64 = 0xbf800000;
              iVar36 = uVar55 - uVar42;
              if (iVar36 == 0 || (int)uVar55 < (int)uVar42) {
                uVar65 = 0xbf800000;
                uVar64 = 0x3f800000;
              }
              uVar4 = *(uint *)((long)puVar59 + 4);
              if ((int)uVar55 < (int)uVar42) {
                uVar42 = uVar55;
              }
              uVar55 = *(uint *)((long)puVar59 + 0xc);
              iVar48 = uVar4 - uVar55;
              if (iVar48 == 0 || (int)uVar4 < (int)uVar55) {
                uVar66 = 0xbf800000;
              }
              *(undefined4 *)puVar41 = uVar65;
              *(undefined4 *)(puVar41 + 4) = uVar66;
              *(uint *)(puVar41 + 8) = uVar37;
              puVar41[0xc] = '\0';
              puVar41[0xd] = '\0';
              puVar41[0xe] = 0x80;
              puVar41[0xf] = '?';
              *(undefined4 *)(puVar41 + (int)uVar20) = uVar64;
              *(undefined4 *)(puVar41 + (long)(int)uVar20 + 4) = uVar66;
              *(uint *)(puVar41 + (long)(int)uVar20 + 8) = uVar37;
              puVar53 = puVar41 + (long)(int)uVar20 + 0xc;
              puVar53[0] = '\0';
              puVar53[1] = '\0';
              puVar53[2] = 0x80;
              puVar53[3] = '?';
              uVar66 = 0xbf800000;
              if (iVar48 == 0 || (int)uVar4 < (int)uVar55) {
                uVar66 = 0x3f800000;
              }
              *(undefined4 *)(puVar41 + lVar58) = uVar65;
              *(undefined4 *)(puVar41 + lVar58 + 4) = uVar66;
              *(uint *)(puVar41 + lVar58 + 8) = uVar37;
              puVar53 = puVar41 + lVar58 + 0xc;
              puVar53[0] = '\0';
              puVar53[1] = '\0';
              puVar53[2] = 0x80;
              puVar53[3] = '?';
              *(undefined4 *)(puVar41 + iVar25) = uVar64;
              *(undefined4 *)(puVar41 + (long)iVar25 + 4) = uVar66;
              *(uint *)(puVar41 + (long)iVar25 + 8) = uVar37;
              if ((int)uVar4 < (int)uVar55) {
                uVar55 = uVar4;
              }
              iVar46 = -iVar48;
              if (0 < iVar48) {
                iVar46 = iVar48;
              }
              puVar53 = puVar41 + (long)iVar25 + 0xc;
              puVar53[0] = '\0';
              puVar53[1] = '\0';
              puVar53[2] = 0x80;
              puVar53[3] = '?';
              iVar48 = -iVar36;
              if (0 < iVar36) {
                iVar48 = iVar36;
              }
              (*(pGVar57->super_Context)._vptr_Context[5])
                        (pGVar57,(ulong)uVar42,(ulong)uVar55,(ulong)(iVar48 + 1),(ulong)(iVar46 + 1)
                        );
              (*(pGVar57->super_Context)._vptr_Context[0x6a])(pGVar57,4,6,0x1403,local_1b0);
              uVar64 = (undefined4)((ulong)in_stack_fffffffffffffc58 >> 0x20);
              bVar61 = puVar32 != puVar59;
              puVar59 = puVar59 + 0x14;
            } while (bVar61);
          }
          dVar22 = (*(pGVar57->super_Context)._vptr_Context[0x79])(pGVar57);
          glu::checkError(dVar22,"Rendering failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsFragOpInteractionCase.cpp"
                          ,0x25c);
          in_stack_fffffffffffffc58 = (pointer)CONCAT44(uVar64,0x1401);
          (*(pGVar57->super_Context)._vptr_Context[0x78])
                    (pGVar57,0,0,(ulong)(uint)(this->m_viewportSize).m_data[0],
                     (ulong)(uint)(this->m_viewportSize).m_data[1],0x1908,in_stack_fffffffffffffc58,
                     *local_1c0);
          local_1c0 = &local_280.super_ConstPixelBufferAccess.m_data;
          uVar40 = (ulong)local_238;
          uVar35 = 0;
          pGVar57 = local_38;
          if ((local_224 & 1) == 0) {
            iVar25 = (*this->m_renderCtx->_vptr_RenderContext[4])();
            lVar58 = CONCAT44(extraout_var_00,iVar25);
            bVar47 = 8 - *(char *)(lVar58 + 8);
            uVar20 = 0;
            if (0 < *(int *)(lVar58 + 0x14)) {
              uVar20 = 0x1000000 << (8U - (char)*(int *)(lVar58 + 0x14) & 0x1f);
            }
            uVar42 = 0x100 << (8U - *(char *)(lVar58 + 0xc) & 0x1f) | 1 << (bVar47 & 0x1f);
            uVar20 = 0x10000 << (8U - *(char *)(lVar58 + 0x10) & 0x1f) | uVar42 | uVar20;
            uVar37 = 1 << (bVar47 & 0x1f) & 0xff;
            if (0xfb < uVar37) {
              uVar37 = 0xfc;
            }
            uVar42 = uVar42 >> 8 & 0xff;
            if (0xfb < uVar42) {
              uVar42 = 0xfc;
            }
            uVar55 = uVar20 >> 0x10 & 0xff;
            if (0xfb < uVar55) {
              uVar55 = 0xfc;
            }
            uVar20 = uVar20 >> 0x18;
            if (0xfb < uVar20) {
              uVar20 = 0xfc;
            }
            pTVar5 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
            local_2a8._0_4_ = RGBA;
            local_2a8._4_4_ = UNORM_INT8;
            if ((void *)local_2e8.m_pixels.m_cap != (void *)0x0) {
              local_2e8.m_pixels.m_cap = (size_t)local_2e8.m_pixels.m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_2a8,local_2e8.m_width,
                       local_2e8.m_height,1,(void *)local_2e8.m_pixels.m_cap);
            local_258.order = RGBA;
            local_258.type = UNORM_INT8;
            if ((void *)local_2c8.m_pixels.m_cap != (void *)0x0) {
              local_2c8.m_pixels.m_cap = (size_t)local_2c8.m_pixels.m_ptr;
            }
            tcu::PixelBufferAccess::PixelBufferAccess
                      ((PixelBufferAccess *)local_2a8,&local_258,local_2c8.m_width,
                       local_2c8.m_height,1,(void *)local_2c8.m_pixels.m_cap);
            bVar61 = tcu::bilinearCompare
                               (pTVar5,"CompareResult","Image comparison result",
                                (ConstPixelBufferAccess *)local_1b0,
                                (ConstPixelBufferAccess *)local_2a8,
                                (RGBA)(uVar20 * 0x1000000 + (uVar55 << 0x10 | uVar42 << 8 | uVar37)
                                      + 0x3030303),COMPARE_LOG_RESULT);
            if (bVar61) {
              iVar25 = this->m_iterNdx + 1;
              this->m_iterNdx = iVar25;
              IVar44 = (IterateResult)(iVar25 < 5);
            }
            else {
              IVar44 = STOP;
              tcu::TestContext::setTestResult
                        ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                         "Image comparison failed");
            }
            tcu::Surface::~Surface(&local_2e8);
            tcu::Surface::~Surface(&local_2c8);
            operator_delete(puVar29,800);
            std::vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_>::~vector
                      ((vector<rsg::VariableValue,_std::allocator<rsg::VariableValue>_> *)&local_308
                      );
            std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                      (&vStack_320);
            if (local_338.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_338.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_338.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_338.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            tcu::TestLog::endSection(local_1b8.m_log);
            return IVar44;
          }
        } while( true );
      }
      lVar58 = lVar58 + 1;
      ppSVar31 = (this->m_vertexShader).m_inputs.
                 super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      local_348 = local_348 + 10;
    } while (lVar58 < (int)((ulong)((long)(this->m_vertexShader).m_inputs.
                                          super__Vector_base<rsg::ShaderInput_*,_std::allocator<rsg::ShaderInput_*>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)ppSVar31) >> 3));
  }
  pIVar28 = (InternalError *)__cxa_allocate_exception(0x38);
  local_298._M_allocated_capacity._0_5_ = 0x5f50514564;
  local_298._M_allocated_capacity._5_3_ = 0x736f50;
  local_298._8_5_ = 0x6e6f697469;
  uStack_2a0._0_4_ = 0xd;
  uStack_2a0._4_4_ = 0;
  local_298._M_local_buf[0xd] = '\0';
  local_2a8 = (undefined1  [8])&local_298;
  pTVar26 = (TextureFormat *)std::__cxx11::string::append(local_2a8);
  local_1b0 = *(undefined1 (*) [8])pTVar26;
  TVar38 = (TextureFormat)(pTVar26 + 2);
  if ((TextureFormat)local_1b0 == TVar38) {
    local_1a0._0_8_ = *(undefined8 *)TVar38;
    local_1a0._8_8_ = pTVar26[3];
    local_1b0 = (undefined1  [8])((long)local_1b0 + 0x10);
  }
  else {
    local_1a0._0_8_ = *(undefined8 *)TVar38;
  }
  local_1a8 = pTVar26[1];
  *pTVar26 = TVar38;
  pTVar26[1].order = R;
  pTVar26[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar26[2].order = R;
  tcu::InternalError::InternalError(pIVar28,(string *)local_1b0);
  __cxa_throw(pIVar28,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FragOpInteractionCase::IterateResult FragOpInteractionCase::iterate (void)
{
	de::Random							rnd					(m_params.seed ^ deInt32Hash(m_iterNdx));
	const tcu::ScopedLogSection			section				(m_testCtx.getLog(), string("Iter") + de::toString(m_iterNdx), string("Iteration ") + de::toString(m_iterNdx));

	const int							positionNdx			= findShaderInputIndex(m_vertexShader.getInputs(), "dEQP_Position");

	const int							numVertices			= 4;
	VertexDataStorage					vertexData			(m_vertexShader.getInputs(), numVertices);
	std::vector<rsg::VariableValue>		uniformValues;
	std::vector<RenderCommand>			renderCmds			(NUM_COMMANDS_PER_ITERATION);

	tcu::Surface						rendered			(m_viewportSize.x(), m_viewportSize.y());
	tcu::Surface						reference			(m_viewportSize.x(), m_viewportSize.y());

	const tcu::Vec4						vtxInterpFactors[]	=
	{
		tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),
		tcu::Vec4(1.0f, 0.0f, 0.5f, 0.5f),
		tcu::Vec4(0.0f, 1.0f, 0.5f, 0.5f),
		tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f)
	};

	rsg::computeUniformValues(rnd, uniformValues, m_unifiedUniforms);

	for (int attribNdx = 0; attribNdx < (int)m_vertexShader.getInputs().size(); ++attribNdx)
	{
		if (attribNdx == positionNdx)
			continue;

		const rsg::ShaderInput*				shaderIn		= m_vertexShader.getInputs()[attribNdx];
		const rsg::VariableType&			varType			= shaderIn->getVariable()->getType();
		const rsg::ConstValueRangeAccess	valueRange		= shaderIn->getValueRange();
		const int							numComponents	= varType.getNumElements();
		const glu::VertexArrayBinding		layoutEntry		= getEntryWithPointer(vertexData, attribNdx);

		DE_ASSERT(varType.getBaseType() == rsg::VariableType::TYPE_FLOAT);

		for (int vtxNdx = 0; vtxNdx < 4; vtxNdx++)
		{
			const int			fNdx	= (attribNdx+vtxNdx+m_iterNdx)%DE_LENGTH_OF_ARRAY(vtxInterpFactors);
			const tcu::Vec4&	f		= vtxInterpFactors[fNdx];

			switch (numComponents)
			{
				case 1:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<1>()));	break;
				case 2:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<2>()));	break;
				case 3:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<3>()));	break;
				case 4:	setVertex(layoutEntry.pointer, vtxNdx, interpolateRange(valueRange, f.toWidth<4>()));	break;
				default:
					DE_ASSERT(false);
			}
		}
	}

	for (vector<RenderCommand>::iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
		computeRandomRenderCommand(rnd, *cmdIter, m_renderCtx.getType().getAPI(), m_viewportSize.x(), m_viewportSize.y());

	// Workaround for inaccurate barycentric/depth computation in current reference renderer:
	// Small bias is added to the draw call depths, in increasing order, to avoid accuracy issues in depth comparison.
	for (int cmdNdx = 0; cmdNdx < (int)renderCmds.size(); cmdNdx++)
		renderCmds[cmdNdx].depth += 0.0231725f * float(cmdNdx);

	{
		const glu::VertexArrayPointer		posPtr				= getEntryWithPointer(vertexData, positionNdx).pointer;

		sglr::Context* const				contexts[]			= { m_glCtx, &m_referenceCtx->context };
		const deUint32						programs[]			= { m_glProgram, m_refProgram };
		tcu::PixelBufferAccess				readDst[]			= { rendered.getAccess(), reference.getAccess() };

		const tcu::Vec4						accurateClearColor	= tcu::Vec4(0.0f, 0.25f, 0.5f, 1.0f);
		const tcu::Vec4						clearColor			= getWellBehavingColor(accurateClearColor, m_renderCtx.getRenderTarget().getPixelFormat());

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(contexts); ndx++)
		{
			sglr::Context&	ctx			= *contexts[ndx];
			const deUint32	program		= programs[ndx];

			setupAttributes(ctx, vertexData, program);

			ctx.disable		(GL_SCISSOR_TEST);
			ctx.colorMask	(GL_TRUE, GL_TRUE, GL_TRUE, GL_TRUE);
			ctx.depthMask	(GL_TRUE);
			ctx.stencilMask	(~0u);
			ctx.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
			ctx.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

			ctx.useProgram	(program);

			for (vector<rsg::VariableValue>::const_iterator uniformIter = uniformValues.begin(); uniformIter != uniformValues.end(); ++uniformIter)
				setUniformValue(ctx, ctx.getUniformLocation(program, uniformIter->getVariable()->getName()), uniformIter->getValue());

			for (vector<RenderCommand>::const_iterator cmdIter = renderCmds.begin(); cmdIter != renderCmds.end(); ++cmdIter)
				render(ctx, posPtr, *cmdIter);

			GLU_EXPECT_NO_ERROR(ctx.getError(), "Rendering failed");

			ctx.readPixels(0, 0, m_viewportSize.x(), m_viewportSize.y(), GL_RGBA, GL_UNSIGNED_BYTE, readDst[ndx].getDataPtr());
		}
	}

	{
		const tcu::RGBA		threshold		= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold()+tcu::RGBA(3,3,3,3);
		const bool			compareOk		= tcu::bilinearCompare(m_testCtx.getLog(), "CompareResult", "Image comparison result", reference.getAccess(), rendered.getAccess(), threshold, tcu::COMPARE_LOG_RESULT);

		if (!compareOk)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
			return STOP;
		}
	}

	m_iterNdx += 1;
	return (m_iterNdx < NUM_ITERATIONS) ? CONTINUE : STOP;
}